

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O0

vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> *
pstack::Procman::Process::procAddressSpace
          (vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
           *__return_storage_ptr__,string *fn)

{
  initializer_list<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_> __l;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Exception *this;
  Exception *pEVar5;
  int *piVar6;
  reference pvVar7;
  uintmax_t uVar8;
  mapped_type *__x;
  size_type __pos;
  VmFlag *__x_00;
  char *extraout_RDX;
  string_view sVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  string_view strv;
  string_view strv_00;
  string_view strv_01;
  string_view strv_02;
  string_view strv_03;
  string_view strv_04;
  string_view sv;
  _Optional_payload_base<pstack::Procman::AddressRange::VmFlag> local_598;
  optional<pstack::Procman::AddressRange::VmFlag> flag;
  string_view tok;
  string_view key;
  string_view lineview;
  size_t trim;
  DevNode *backing;
  char local_4a9;
  const_iterator pvStack_4a8;
  value_type c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  pair<const_char,_pstack::Procman::AddressRange::Permission> local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  iterator local_460;
  size_type local_458;
  undefined1 local_450 [8];
  string_view perms;
  AddressRange *range;
  string_view remains;
  char *local_400;
  Exception local_3f8;
  long local_258;
  ifstream input;
  undefined1 local_50 [8];
  string buf;
  string *fn_local;
  vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> *rv;
  
  std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::vector
            (__return_storage_ptr__);
  std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
  reserve(__return_storage_ptr__,0x2800);
  std::__cxx11::string::string((string *)local_50);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,0x400);
  std::ifstream::ifstream(&local_258,fn,8);
  bVar1 = std::ifstream::is_open();
  if (((bVar1 & 1) != 0) && (bVar1 = std::ios::good(), (bVar1 & 1) != 0)) {
    while( true ) {
      bVar2 = std::ios::operator_cast_to_bool
                        ((void *)((long)&local_258 + *(long *)(local_258 + -0x18)));
      bVar3 = false;
      if (bVar2) {
        iVar4 = std::istream::peek();
        bVar3 = iVar4 != -1;
      }
      if (!bVar3) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_258,(string *)local_50);
      _range = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
      std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
      emplace_back<>(__return_storage_ptr__);
      pvVar7 = std::
               vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
               ::back(__return_storage_ptr__);
      sVar9 = nextTok<char>((string_view *)&range,'-');
      strv._M_str = sVar9._M_str;
      strv._M_len = (size_t)strv._M_str;
      uVar8 = hex2int((Procman *)sVar9._M_len,strv);
      pvVar7->start = uVar8;
      sVar9 = nextTok<char>((string_view *)&range,' ');
      strv_00._M_str = sVar9._M_str;
      perms._M_str = (char *)sVar9._M_len;
      strv_00._M_len = (size_t)strv_00._M_str;
      uVar8 = hex2int((Procman *)perms._M_str,strv_00);
      pvVar7->end = uVar8;
      sVar9 = nextTok<char>((string_view *)&range,' ');
      perms._M_len = (size_t)sVar9._M_str;
      local_450 = (undefined1  [8])sVar9._M_len;
      if (procAddressSpace(std::__cxx11::string_const&)::flagmap == '\0') {
        iVar4 = __cxa_guard_acquire(&procAddressSpace(std::__cxx11::string_const&)::flagmap);
        sVar9._M_str = (char *)perms._M_len;
        sVar9._M_len = (size_t)local_450;
        if (iVar4 != 0) {
          local_478 = 0x200000078;
          uStack_470 = 0x300000070;
          local_488.first = 'r';
          local_488._1_3_ = 0;
          local_488.second = read;
          uStack_480 = 0x100000077;
          local_468 = 0x500000073;
          local_460 = &local_488;
          local_458 = 5;
          std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>::
          allocator((allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_> *)
                    ((long)&__range3 + 5));
          __l._M_len = local_458;
          __l._M_array = local_460;
          std::
          unordered_map<char,_pstack::Procman::AddressRange::Permission,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>_>
          ::unordered_map(&procAddressSpace::flagmap,__l,0,(hasher *)((long)&__range3 + 7),
                          (key_equal *)((long)&__range3 + 6),
                          (allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>
                           *)((long)&__range3 + 5));
          std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>::
          ~allocator((allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_> *
                     )((long)&__range3 + 5));
          __cxa_atexit(std::
                       unordered_map<char,_pstack::Procman::AddressRange::Permission,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>_>
                       ::~unordered_map,&procAddressSpace::flagmap,&__dso_handle);
          __cxa_guard_release(&procAddressSpace(std::__cxx11::string_const&)::flagmap);
          sVar9._M_str = (char *)perms._M_len;
          sVar9._M_len = (size_t)local_450;
        }
      }
      perms._M_len = (size_t)sVar9._M_str;
      local_450 = (undefined1  [8])sVar9._M_len;
      __begin3 = local_450;
      __end3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)__begin3);
      pvStack_4a8 = std::basic_string_view<char,_std::char_traits<char>_>::end
                              ((basic_string_view<char,_std::char_traits<char>_> *)__begin3);
      for (; __end3 != pvStack_4a8; __end3 = __end3 + 1) {
        local_4a9 = *__end3;
        if (local_4a9 != '-') {
          __x = std::
                unordered_map<char,_pstack::Procman::AddressRange::Permission,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>_>
                ::at(&procAddressSpace::flagmap,&local_4a9);
          std::
          set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
          ::insert(&pvVar7->permissions,__x);
        }
      }
      sVar9 = nextTok<char>((string_view *)&range,' ');
      strv_01._M_str = sVar9._M_str;
      strv_01._M_len = (size_t)strv_01._M_str;
      uVar8 = hex2int((Procman *)sVar9._M_len,strv_01);
      pvVar7->offset = uVar8;
      sVar9 = nextTok<char>((string_view *)&range,':');
      strv_02._M_str = sVar9._M_str;
      strv_02._M_len = (size_t)strv_02._M_str;
      uVar8 = hex2int((Procman *)sVar9._M_len,strv_02);
      (pvVar7->backing).major = (int)uVar8;
      sVar9 = nextTok<char>((string_view *)&range,' ');
      strv_03._M_str = sVar9._M_str;
      strv_03._M_len = (size_t)strv_03._M_str;
      uVar8 = hex2int((Procman *)sVar9._M_len,strv_03);
      (pvVar7->backing).minor = (int)uVar8;
      sVar9 = nextTok<char>((string_view *)&range,' ');
      strv_04._M_str = sVar9._M_str;
      strv_04._M_len = (size_t)strv_04._M_str;
      uVar8 = hex2int((Procman *)sVar9._M_len,strv_04);
      (pvVar7->backing).inode = uVar8;
      __pos = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)&range," ",0);
      if (__pos == 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&(pvVar7->backing).path,"<anon>");
      }
      else {
        bVar10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&range,__pos,
                            0xffffffffffffffff);
        lineview._M_str = (char *)bVar10._M_len;
        std::__cxx11::string::operator=
                  ((string *)&(pvVar7->backing).path,
                   (basic_string_view<char,_std::char_traits<char>_> *)&lineview._M_str);
      }
      while( true ) {
        iVar4 = std::istream::peek();
        iVar4 = isupper(iVar4);
        if (iVar4 == 0) break;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_258,(string *)local_50);
        join_0x00000010_0x00000000_ =
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
        sVar9 = nextTok<char>((string_view *)&key._M_str,':');
        key._M_len = (size_t)sVar9._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&tok._M_str,"VmFlags");
        bVar3 = std::operator==(sVar9,stack0xfffffffffffffaa0);
        if (bVar3) {
          while( true ) {
            sVar9 = nextTok<char>((string_view *)&key._M_str,' ');
            tok._M_len = (size_t)sVar9._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&flag,"");
            bVar3 = std::operator==(sVar9,_flag);
            if (bVar3) break;
            sv._M_str = extraout_RDX;
            sv._M_len = tok._M_len;
            local_598 = (_Optional_payload_base<pstack::Procman::AddressRange::VmFlag>)
                        AddressRange::vmflag((AddressRange *)sVar9._M_len,sv);
            bVar3 = std::optional::operator_cast_to_bool((optional *)&local_598);
            if (bVar3) {
              __x_00 = std::optional<pstack::Procman::AddressRange::VmFlag>::operator*
                                 ((optional<pstack::Procman::AddressRange::VmFlag> *)&local_598);
              std::
              set<pstack::Procman::AddressRange::VmFlag,_std::less<pstack::Procman::AddressRange::VmFlag>,_std::allocator<pstack::Procman::AddressRange::VmFlag>_>
              ::insert(&pvVar7->vmflags,__x_00);
            }
          }
        }
      }
    }
    std::ifstream::~ifstream(&local_258);
    std::__cxx11::string::~string((string *)local_50);
    return __return_storage_ptr__;
  }
  remains._M_str._7_1_ = 1;
  this = (Exception *)__cxa_allocate_exception();
  memset(&local_3f8,0,0x1a0);
  Exception::Exception(&local_3f8);
  pEVar5 = Exception::operator<<(&local_3f8,(char (*) [28])"unable to open smaps file: ");
  piVar6 = __errno_location();
  local_400 = strerror(*piVar6);
  pEVar5 = Exception::operator<<(pEVar5,&local_400);
  Exception::Exception(this,pEVar5);
  remains._M_str._7_1_ = 0;
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

std::vector<AddressRange>
Process::procAddressSpace(const std::string &fn) {
    std::vector<AddressRange> rv;
    // there can be many mappings, and we don't call this very often, so
    // pre-allocate the space we need.
    rv.reserve(10240);

    std::string buf;
    buf.reserve( 1024 );
    std::ifstream input{fn};
    if ( !input.is_open() || !input.good()){
         throw ( Exception() << "unable to open smaps file: " << strerror(errno) );
    }
    while (input && input.peek() != EOF) {
       // We could just use operator>> to stream each field of the line to the
       // relevant fields, but it is ridiculously slow, I Think mostly because
       // of the use of std::hex invoking std::use_facet, which uses dynamic
       // casts. So, instead, parse out the line the hard way. This first line
       // includes details of the address range covered, and some basic
       // details. The /proc/<pid>/maps file includes just these lines.
       std::getline( input, buf );
       std::string_view remains{ buf };

       rv.emplace_back();
       AddressRange &range = rv.back();
       range.start = hex2int(nextTok( remains, '-' ));
       range.end = hex2int(nextTok( remains, ' ' ));

       std::string_view  perms = nextTok( remains, ' ' );

       static const std::unordered_map<char, AddressRange::Permission> flagmap {
           { 'r', AddressRange::Permission::read },
           { 'w', AddressRange::Permission::write },
           { 'x', AddressRange::Permission::exec },
           { 'p', AddressRange::Permission::priv },
           { 's', AddressRange::Permission::shared },
       };
       for (auto c : perms)
           if (c != '-')
               range.permissions.insert(flagmap.at(c));

       range.offset = hex2int(nextTok( remains, ' ' ));

       auto &backing = range.backing;
       backing.major = hex2int(nextTok( remains, ':' ));
       backing.minor = hex2int(nextTok( remains, ' ' ));
       backing.inode = hex2int(nextTok( remains, ' ' ));

       size_t trim = remains.find_first_not_of(" ");
       if ( trim != std::string::npos ) {
          backing.path = remains.substr( trim );
       } else {
          backing.path = "<anon>";
       }

       // Now process the attribute lines under the details of the range. These
       // are only present for /proc/<pid>/smaps.

       while (isupper(input.peek())) {
          std::getline(input, buf);
          std::string_view lineview { buf };
          auto key = nextTok( lineview, ':' );
          if (key == "VmFlags") {
             for (;;) {
                auto tok = nextTok( lineview, ' ' );
                if (tok == "")
                   break;
                auto flag = AddressRange::vmflag(tok);
                if (flag)
                   range.vmflags.insert( *flag );
             }
          }
       }
    }
    return rv;
}